

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::IsSafeToTransferInPrepass(GlobOpt *this,StackSym *srcSym,ValueInfo *srcValueInfo)

{
  bool bVar1;
  BOOLEAN BVar2;
  bool bVar3;
  undefined8 in_RAX;
  StackSym *pSVar4;
  int32 local_24 [2];
  int32 intConstantValue;
  
  local_24[0] = (int32)((ulong)in_RAX >> 0x20);
  bVar3 = true;
  if ((srcSym->field_0x1a & 4) == 0) {
    bVar1 = ValueInfo::TryGetIntConstantValue(srcValueInfo,local_24,false);
    if ((bVar1) && (pSVar4 = GetTaggedIntConstantStackSym(this,local_24[0]), pSVar4 == srcSym)) {
      return true;
    }
    BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((this->currentBlock->loop->regAlloc).liveOnBackEdgeSyms,
                       (srcSym->super_Sym).m_id);
    if (BVar2 != '\0') {
      bVar3 = Loop::IsSymAssignedToInSelfOrParents(this->currentBlock->loop,srcSym);
      bVar3 = !bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool
GlobOpt::IsSafeToTransferInPrepass(StackSym * const srcSym, ValueInfo *const srcValueInfo) const
{
    int32 intConstantValue;
    return
        srcSym->IsFromByteCodeConstantTable() ||
        (
            srcValueInfo->TryGetIntConstantValue(&intConstantValue) &&
            !Js::TaggedInt::IsOverflow(intConstantValue) &&
            GetTaggedIntConstantStackSym(intConstantValue) == srcSym
            ) ||
        !currentBlock->loop->regAlloc.liveOnBackEdgeSyms->Test(srcSym->m_id) ||
        !currentBlock->loop->IsSymAssignedToInSelfOrParents(srcSym);
}